

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

SocketAddress * __thiscall
kj::anon_unknown_0::NetworkAddressImpl::chooseOneAddress(NetworkAddressImpl *this)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  SocketAddress *pSVar4;
  Fault local_58;
  Fault f;
  size_t local_48;
  DebugExpression<unsigned_long> local_40;
  undefined1 local_38 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  NetworkAddressImpl *this_local;
  
  _kjCondition._32_8_ = this;
  local_48 = Array<kj::(anonymous_namespace)::SocketAddress>::size(&this->addrs);
  local_40 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_48);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_38,&local_40,
             (int *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[24]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x656,FAILED,"addrs.size() > 0","_kjCondition,\"No addresses available.\"",
               (DebugComparison<unsigned_long,_int> *)local_38,
               (char (*) [24])"No addresses available.");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  uVar1 = this->counter;
  this->counter = uVar1 + 1;
  sVar3 = Array<kj::(anonymous_namespace)::SocketAddress>::size(&this->addrs);
  pSVar4 = Array<kj::(anonymous_namespace)::SocketAddress>::operator[]
                     (&this->addrs,(ulong)uVar1 % sVar3);
  return pSVar4;
}

Assistant:

const SocketAddress& chooseOneAddress() {
    KJ_REQUIRE(addrs.size() > 0, "No addresses available.");
    return addrs[counter++ % addrs.size()];
  }